

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestHarness_cTest.cpp
# Opt level: O0

void __thiscall
TEST_TestHarness_c_checkLongInt_Test::~TEST_TestHarness_c_checkLongInt_Test
          (TEST_TestHarness_c_checkLongInt_Test *this)

{
  TEST_TestHarness_c_checkLongInt_Test *this_local;
  
  ~TEST_TestHarness_c_checkLongInt_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(TestHarness_c, checkLongInt)
{
    CHECK_EQUAL_C_LONG(2, 2);
    fixture->setTestFunction(failLongIntMethod_);
    fixture->runAllTests();
    fixture->assertPrintContains("expected <1 (0x1)>\n\tbut was  <2 (0x2)>");
    fixture->assertPrintContains("arness_c");
    CHECK(!hasDestructorOfTheDestructorCheckedBeenCalled);
}